

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O2

ALCboolean alcMakeContextCurrent(ALCcontext *_ctx)

{
  ContextWrapper *pCVar1;
  ALCboolean b;
  ALenum *in_RSI;
  ALCcontext *pAVar2;
  DeviceWrapper *device;
  
  APILOCK();
  IO_ENTRYINFO(ALEE_alcMakeContextCurrent);
  IO_UINT64((uint64)_ctx);
  if (_ctx == (ALCcontext *)0x0) {
    pAVar2 = (ALCcontext *)0x0;
  }
  else {
    pAVar2 = *(ALCcontext **)_ctx;
  }
  b = (*REAL_alcMakeContextCurrent)(pAVar2);
  IO_ALCBOOLEAN(b);
  if (b == '\0') {
LAB_001057e3:
    if (current_context != (ContextWrapper *)0x0) {
      device = current_context->device;
      goto LAB_001057f7;
    }
  }
  else {
    current_context = (ContextWrapper *)_ctx;
    if (_ctx != (ALCcontext *)0x0) {
      if (_ctx[0x1c] == (ALCcontext)0x0) {
        _ctx[0x1c] = (ALCcontext)0x1;
        query_context_string((ContextWrapper *)_ctx,0xb002);
        query_context_string((ContextWrapper *)_ctx,0xb003);
        query_context_string((ContextWrapper *)_ctx,0xb001);
        in_RSI = (ALenum *)0xb004;
        query_context_string((ContextWrapper *)_ctx,0xb004);
        if (current_context == (ContextWrapper *)0x0) goto LAB_001057f5;
      }
      pCVar1 = current_context;
      check_context_state_enum((int)current_context + 0x820,in_RSI);
      check_context_state_float(0xc000,&pCVar1->doppler_factor);
      check_context_state_float(0xc001,&pCVar1->doppler_velocity);
      check_context_state_float(0xc003,&pCVar1->speed_of_sound);
      check_listener_state();
      goto LAB_001057e3;
    }
  }
LAB_001057f5:
  device = (DeviceWrapper *)0x0;
LAB_001057f7:
  check_alc_error_events(device);
  check_al_async_states();
  APIUNLOCK();
  return b;
}

Assistant:

ALCboolean alcMakeContextCurrent(ALCcontext *_ctx)
{
    ContextWrapper *ctx = (ContextWrapper *) _ctx;
    ALCboolean retval;
    IO_START(alcMakeContextCurrent);
    IO_PTR(ctx);
    retval = REAL_alcMakeContextCurrent(ctx ? ctx->ctx : NULL);
    IO_ALCBOOLEAN(retval);
    if (retval) {
        current_context = ctx;
        if (ctx) {
            check_context_static_state(ctx);
            check_context_state();
        }
    }
    IO_END_ALC(current_context ? current_context->device : NULL);
    return retval;
}